

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<char,_10>::Resize(TPZManVector<char,_10> *this,int64_t newsize,char *object)

{
  char cVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  int64_t i;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  if (-1 < newsize) {
    lVar6 = (this->super_TPZVec<char>).fNElements;
    if (lVar6 != newsize) {
      lVar5 = (this->super_TPZVec<char>).fNAlloc;
      if (lVar5 < newsize) {
        if ((ulong)newsize < 0xb) {
          pcVar4 = (this->super_TPZVec<char>).fStore;
          pcVar2 = this->fExtAlloc;
          lVar5 = 0;
          if (lVar6 < 1) {
            lVar6 = lVar5;
          }
          for (; lVar6 != lVar5; lVar5 = lVar5 + 1) {
            pcVar2[lVar5] = pcVar4[lVar5];
          }
          for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
            pcVar2[lVar6] = *object;
          }
          pcVar4 = (this->super_TPZVec<char>).fStore;
          if (pcVar4 != (char *)0x0 && pcVar4 != pcVar2) {
            operator_delete__(pcVar4);
          }
          (this->super_TPZVec<char>).fStore = pcVar2;
          (this->super_TPZVec<char>).fNElements = newsize;
          (this->super_TPZVec<char>).fNAlloc = 10;
        }
        else {
          dVar8 = (double)lVar5 * 1.2;
          uVar7 = (long)dVar8;
          if (dVar8 < (double)newsize) {
            uVar7 = newsize;
          }
          pcVar4 = (char *)operator_new__(uVar7);
          pcVar2 = (this->super_TPZVec<char>).fStore;
          lVar5 = 0;
          if (lVar6 < 1) {
            lVar6 = lVar5;
          }
          for (; lVar6 != lVar5; lVar5 = lVar5 + 1) {
            pcVar4[lVar5] = pcVar2[lVar5];
          }
          cVar1 = *object;
          for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
            pcVar4[lVar6] = cVar1;
          }
          if (pcVar2 != (char *)0x0 && pcVar2 != this->fExtAlloc) {
            operator_delete__(pcVar2);
          }
          (this->super_TPZVec<char>).fStore = pcVar4;
          (this->super_TPZVec<char>).fNElements = newsize;
          (this->super_TPZVec<char>).fNAlloc = uVar7;
        }
      }
      else {
        for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
          (this->super_TPZVec<char>).fStore[lVar6] = *object;
        }
        (this->super_TPZVec<char>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}